

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall Win32MakefileGenerator::writeIncPart(Win32MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QList<ProString> *this_00;
  QString *this_01;
  qsizetype qVar2;
  QTextStream *this_02;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  ProStringList *incs;
  QString inc;
  undefined4 in_stack_ffffffffffffff08;
  PatternOption in_stack_ffffffffffffff0c;
  QMakeProject *in_stack_ffffffffffffff10;
  int local_c4;
  undefined1 local_a8 [52];
  uint local_74;
  undefined1 local_70 [24];
  QRegularExpression local_58 [8];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<(in_RSI,"INCPATH       = ");
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffff10,
                 (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this_00 = &QMakeProject::values
                       (in_stack_ffffffffffffff10,
                        (ProKey *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))->
             super_QList<ProString>;
  ProKey::~ProKey((ProKey *)0x2b5ca9);
  local_c4 = 0;
  while( true ) {
    this_01 = (QString *)(long)local_c4;
    qVar2 = QList<ProString>::size(this_00);
    if (qVar2 <= (long)this_01) break;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    QList<ProString>::at
              ((QList<ProString> *)in_stack_ffffffffffffff10,
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    ProString::toQString((ProString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
    ;
    QString::QString(this_01,(char *)in_RSI);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    QRegularExpression::QRegularExpression
              (local_58,(QString *)local_70,(QFlags_conflict *)(ulong)local_74);
    QString::QString(this_01,(char *)in_RSI);
    QString::replace((QRegularExpression *)&local_50,(QString *)local_58);
    QString::~QString((QString *)0x2b5da0);
    QRegularExpression::~QRegularExpression(local_58);
    QString::~QString((QString *)0x2b5dba);
    bVar1 = QString::isEmpty((QString *)0x2b5dc7);
    if (!bVar1) {
      in_stack_ffffffffffffff10 = (QMakeProject *)QTextStream::operator<<(in_RSI,"-I");
      (**(code **)(*in_RDI + 0x60))(local_a8,in_RDI,&local_50);
      this_02 = (QTextStream *)
                QTextStream::operator<<
                          ((QTextStream *)in_stack_ffffffffffffff10,(QString *)local_a8);
      QTextStream::operator<<(this_02,' ');
      QString::~QString((QString *)0x2b5e1f);
    }
    QString::~QString((QString *)0x2b5e2c);
    local_c4 = local_c4 + 1;
  }
  ::operator<<((QTextStream *)in_stack_ffffffffffffff10,
               (QTextStreamFunction)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeIncPart(QTextStream &t)
{
    t << "INCPATH       = ";

    const ProStringList &incs = project->values("INCLUDEPATH");
    for(int i = 0; i < incs.size(); ++i) {
        QString inc = incs.at(i).toQString();
        inc.replace(QRegularExpression("\\\\$"), "");
        if(!inc.isEmpty())
            t << "-I" << escapeFilePath(inc) << ' ';
    }
    t << Qt::endl;
}